

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O1

int ExtractAlpha_SSE2(uint8_t *argb,int argb_stride,int width,int height,uint8_t *alpha,
                     int alpha_stride)

{
  byte *pbVar1;
  byte bVar2;
  short sVar10;
  uint uVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  byte bVar15;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  undefined1 auVar16 [16];
  undefined1 auVar24 [16];
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  
  auVar16 = _DAT_00127480;
  if (0 < height) {
    uVar11 = width - 1U & 0xfffffff8;
    bVar15 = 0xff;
    bVar17 = 0xff;
    bVar18 = 0xff;
    bVar19 = 0xff;
    bVar20 = 0xff;
    bVar21 = 0xff;
    bVar22 = 0xff;
    bVar23 = 0xff;
    iVar13 = 0;
    bVar12 = 0xff;
    do {
      uVar14 = 0;
      if (0 < (int)uVar11) {
        do {
          auVar24 = packssdw(*(undefined1 (*) [16])(argb + uVar14 * 4) & auVar16,
                             *(undefined1 (*) [16])(argb + uVar14 * 4 + 0x10) & auVar16);
          sVar10 = auVar24._0_2_;
          bVar2 = (0 < sVar10) * (sVar10 < 0x100) * auVar24[0] - (0xff < sVar10);
          sVar10 = auVar24._2_2_;
          bVar3 = (0 < sVar10) * (sVar10 < 0x100) * auVar24[2] - (0xff < sVar10);
          sVar10 = auVar24._4_2_;
          bVar4 = (0 < sVar10) * (sVar10 < 0x100) * auVar24[4] - (0xff < sVar10);
          sVar10 = auVar24._6_2_;
          bVar5 = (0 < sVar10) * (sVar10 < 0x100) * auVar24[6] - (0xff < sVar10);
          sVar10 = auVar24._8_2_;
          bVar6 = (0 < sVar10) * (sVar10 < 0x100) * auVar24[8] - (0xff < sVar10);
          sVar10 = auVar24._10_2_;
          bVar7 = (0 < sVar10) * (sVar10 < 0x100) * auVar24[10] - (0xff < sVar10);
          sVar10 = auVar24._12_2_;
          bVar8 = (0 < sVar10) * (sVar10 < 0x100) * auVar24[0xc] - (0xff < sVar10);
          sVar10 = auVar24._14_2_;
          bVar9 = (0 < sVar10) * (sVar10 < 0x100) * auVar24[0xe] - (0xff < sVar10);
          pbVar1 = alpha + uVar14;
          *pbVar1 = bVar2;
          pbVar1[1] = bVar3;
          pbVar1[2] = bVar4;
          pbVar1[3] = bVar5;
          pbVar1[4] = bVar6;
          pbVar1[5] = bVar7;
          pbVar1[6] = bVar8;
          pbVar1[7] = bVar9;
          bVar15 = bVar15 & bVar2;
          bVar17 = bVar17 & bVar3;
          bVar18 = bVar18 & bVar4;
          bVar19 = bVar19 & bVar5;
          bVar20 = bVar20 & bVar6;
          bVar21 = bVar21 & bVar7;
          bVar22 = bVar22 & bVar8;
          bVar23 = bVar23 & bVar9;
          uVar14 = uVar14 + 8;
        } while ((long)uVar14 < (long)(int)uVar11);
      }
      if ((int)uVar14 < width) {
        uVar14 = uVar14 & 0xffffffff;
        do {
          bVar9 = argb[uVar14 * 4];
          alpha[uVar14] = bVar9;
          bVar12 = bVar12 & bVar9;
          uVar14 = uVar14 + 1;
        } while ((uint)width != uVar14);
      }
      argb = argb + argb_stride;
      alpha = alpha + alpha_stride;
      iVar13 = iVar13 + 1;
    } while (iVar13 != height);
    auVar16[0] = -(bVar15 == 0xff);
    auVar16[1] = -(bVar17 == 0xff);
    auVar16[2] = -(bVar18 == 0xff);
    auVar16[3] = -(bVar19 == 0xff);
    auVar16[4] = -(bVar20 == 0xff);
    auVar16[5] = -(bVar21 == 0xff);
    auVar16[6] = -(bVar22 == 0xff);
    auVar16[7] = -(bVar23 == 0xff);
    auVar16[8] = 0xff;
    auVar16[9] = 0xff;
    auVar16[10] = 0xff;
    auVar16[0xb] = 0xff;
    auVar16[0xc] = 0xff;
    auVar16[0xd] = 0xff;
    auVar16[0xe] = 0xff;
    auVar16[0xf] = 0xff;
    return (uint)((bVar12 & (SUB161(auVar16 >> 7,0) & 1 | (SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar16 >> 0x37,0) & 1) << 6 | SUB161(auVar16 >> 0x3f,0) << 7))
                 == 0xff);
  }
  return 1;
}

Assistant:

static int ExtractAlpha_SSE2(const uint8_t* WEBP_RESTRICT argb, int argb_stride,
                             int width, int height,
                             uint8_t* WEBP_RESTRICT alpha, int alpha_stride) {
  // alpha_and stores an 'and' operation of all the alpha[] values. The final
  // value is not 0xff if any of the alpha[] is not equal to 0xff.
  uint32_t alpha_and = 0xff;
  int i, j;
  const __m128i a_mask = _mm_set1_epi32(0xff);  // to preserve alpha
  const __m128i all_0xff = _mm_set_epi32(0, 0, ~0, ~0);
  __m128i all_alphas = all_0xff;

  // We must be able to access 3 extra bytes after the last written byte
  // 'src[4 * width - 4]', because we don't know if alpha is the first or the
  // last byte of the quadruplet.
  const int limit = (width - 1) & ~7;

  for (j = 0; j < height; ++j) {
    const __m128i* src = (const __m128i*)argb;
    for (i = 0; i < limit; i += 8) {
      // load 32 argb bytes
      const __m128i a0 = _mm_loadu_si128(src + 0);
      const __m128i a1 = _mm_loadu_si128(src + 1);
      const __m128i b0 = _mm_and_si128(a0, a_mask);
      const __m128i b1 = _mm_and_si128(a1, a_mask);
      const __m128i c0 = _mm_packs_epi32(b0, b1);
      const __m128i d0 = _mm_packus_epi16(c0, c0);
      // store
      _mm_storel_epi64((__m128i*)&alpha[i], d0);
      // accumulate eight alpha 'and' in parallel
      all_alphas = _mm_and_si128(all_alphas, d0);
      src += 2;
    }
    for (; i < width; ++i) {
      const uint32_t alpha_value = argb[4 * i];
      alpha[i] = alpha_value;
      alpha_and &= alpha_value;
    }
    argb += argb_stride;
    alpha += alpha_stride;
  }
  // Combine the eight alpha 'and' into a 8-bit mask.
  alpha_and &= _mm_movemask_epi8(_mm_cmpeq_epi8(all_alphas, all_0xff));
  return (alpha_and == 0xff);
}